

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Book.cpp
# Opt level: O0

void __thiscall Book::Book(Book *this,string *name,double price)

{
  string local_40;
  double local_20;
  double price_local;
  string *name_local;
  Book *this_local;
  
  local_20 = price;
  price_local = (double)name;
  name_local = (string *)this;
  std::__cxx11::string::string((string *)&local_40,(string *)name);
  Product::Product(&this->super_Product,&local_40,local_20);
  std::__cxx11::string::~string((string *)&local_40);
  (this->super_Product)._vptr_Product = (_func_int **)&PTR_printProperties_0011ab40;
  std::__cxx11::string::string((string *)&this->author);
  std::__cxx11::string::string((string *)&this->publisher);
  return;
}

Assistant:

Book::Book(string name, double price):Product(name,price){

}